

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to4.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  char cVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  undefined4 *puVar11;
  ulong uVar12;
  uint _w;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  void *pvVar18;
  undefined4 *puVar19;
  int i_1;
  int i;
  long lVar20;
  long lVar21;
  ulong local_b0;
  Mat local_80;
  long local_38;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_80,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar10 = inch + 0xf;
  if (-1 < inch) {
    iVar10 = inch;
  }
  iVar8 = outch + 7;
  iVar4 = outch + 0xf;
  if (-1 < outch) {
    iVar8 = outch;
    iVar4 = outch;
  }
  cVar5 = (char)(outch % 0x10);
  cVar7 = (char)outch - ((byte)iVar8 & 0xf8);
  Mat::create(kernel_tm,_w * 0x100,iVar10 >> 4,
              (int)((char)(((byte)(cVar7 >> 7) >> 6) + cVar7) >> 2) +
              (int)((char)(((byte)(cVar5 >> 7) >> 5) + cVar5) >> 3) + (iVar4 >> 4),4,
              (Allocator *)0x0);
  lVar6 = (long)inch;
  uVar9 = (ulong)_w;
  uVar15 = 0;
  if (0xf < outch) {
    pvVar1 = kernel_tm->data;
    local_38 = kernel_tm->cstep * kernel_tm->elemsize;
    local_b0 = 0;
    do {
      if (0xf < inch) {
        pvVar18 = (void *)((local_b0 >> 4) * local_38 + (long)pvVar1);
        puVar16 = (undefined4 *)
                  (local_80.cstep * local_80.elemsize * local_b0 + (long)local_80.data);
        lVar13 = 0;
        do {
          if (0 < (int)_w) {
            uVar15 = 0;
            puVar11 = puVar16;
            do {
              lVar20 = 0;
              puVar17 = puVar11;
              do {
                pvVar14 = pvVar18;
                lVar21 = 0;
                puVar19 = puVar17;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar21) = *puVar19;
                  puVar19 = (undefined4 *)((long)puVar19 + local_80.cstep * local_80.elemsize);
                  lVar21 = lVar21 + 4;
                } while (lVar21 != 0x40);
                lVar20 = lVar20 + 1;
                puVar17 = (undefined4 *)((long)puVar17 + (long)local_80.w * local_80.elemsize);
                pvVar18 = (void *)((long)pvVar14 + 0x40);
              } while (lVar20 != 0x10);
              uVar15 = uVar15 + 1;
              puVar11 = puVar11 + 1;
              pvVar18 = (void *)((long)pvVar14 + 0x40);
            } while (uVar15 != uVar9);
            pvVar18 = (void *)((long)pvVar14 + 0x40);
          }
          lVar20 = lVar13 + 0x1f;
          puVar16 = puVar16 + (long)local_80.w * local_80.elemsize * 4;
          lVar13 = lVar13 + 0x10;
        } while (lVar20 < lVar6);
      }
      uVar15 = local_b0 + 0x10;
      uVar12 = local_b0 + 0x1f;
      local_b0 = uVar15;
    } while (uVar12 < (uint)outch);
  }
  if ((int)((uint)uVar15 | 7) < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    uVar15 = uVar15 & 0xffffffff;
    do {
      if (0xf < inch) {
        pvVar18 = (void *)((ulong)(((uint)(uVar15 >> 4) & 0xfffffff) +
                                  (uint)(((uint)uVar15 >> 3 & 1) != 0)) * sVar2 * sVar3 +
                          (long)pvVar1);
        puVar16 = (undefined4 *)(local_80.cstep * local_80.elemsize * uVar15 + (long)local_80.data);
        lVar13 = 0;
        do {
          if (0 < (int)_w) {
            uVar12 = 0;
            puVar11 = puVar16;
            do {
              lVar20 = 0;
              puVar17 = puVar11;
              do {
                pvVar14 = pvVar18;
                lVar21 = 0;
                puVar19 = puVar17;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar21) = *puVar19;
                  puVar19 = (undefined4 *)((long)puVar19 + local_80.cstep * local_80.elemsize);
                  lVar21 = lVar21 + 4;
                } while (lVar21 != 0x20);
                lVar20 = lVar20 + 1;
                puVar17 = (undefined4 *)((long)puVar17 + (long)local_80.w * local_80.elemsize);
                pvVar18 = (void *)((long)pvVar14 + 0x20);
              } while (lVar20 != 0x10);
              uVar12 = uVar12 + 1;
              puVar11 = puVar11 + 1;
              pvVar18 = (void *)((long)pvVar14 + 0x20);
            } while (uVar12 != uVar9);
            pvVar18 = (void *)((long)pvVar14 + 0x20);
          }
          lVar20 = lVar13 + 0x1f;
          puVar16 = puVar16 + (long)local_80.w * local_80.elemsize * 4;
          lVar13 = lVar13 + 0x10;
        } while (lVar20 < lVar6);
      }
      uVar15 = uVar15 + 8;
    } while ((int)((uint)uVar15 | 7) < outch);
  }
  if ((int)((uint)uVar15 | 3) < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    local_b0 = uVar15 & 0xffffffff;
    do {
      if (0xf < inch) {
        pvVar18 = (void *)((ulong)(((uint)(local_b0 >> 4) & 0xfffffff) + ((uint)(local_b0 >> 3) & 1)
                                  + (uint)(((uint)local_b0 >> 2 & 1) != 0)) * sVar2 * sVar3 +
                          (long)pvVar1);
        puVar16 = (undefined4 *)
                  (local_80.cstep * local_80.elemsize * local_b0 + (long)local_80.data);
        lVar13 = 0;
        do {
          if (0 < (int)_w) {
            uVar15 = 0;
            puVar11 = puVar16;
            do {
              lVar20 = 0;
              puVar17 = puVar11;
              do {
                pvVar14 = pvVar18;
                lVar21 = 0;
                puVar19 = puVar17;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar21) = *puVar19;
                  puVar19 = (undefined4 *)((long)puVar19 + local_80.cstep * local_80.elemsize);
                  lVar21 = lVar21 + 4;
                } while (lVar21 != 0x10);
                lVar20 = lVar20 + 1;
                puVar17 = (undefined4 *)((long)puVar17 + (long)local_80.w * local_80.elemsize);
                pvVar18 = (void *)((long)pvVar14 + 0x10);
              } while (lVar20 != 0x10);
              uVar15 = uVar15 + 1;
              puVar11 = puVar11 + 1;
              pvVar18 = (void *)((long)pvVar14 + 0x10);
            } while (uVar15 != uVar9);
            pvVar18 = (void *)((long)pvVar14 + 0x10);
          }
          lVar20 = lVar13 + 0x1f;
          puVar16 = puVar16 + (long)local_80.w * local_80.elemsize * 4;
          lVar13 = lVar13 + 0x10;
        } while (lVar20 < lVar6);
      }
      local_b0 = local_b0 + 4;
    } while ((int)((uint)local_b0 | 3) < outch);
  }
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount == 0) {
      if (local_80.allocator == (Allocator *)0x0) {
        if (local_80.data != (void *)0x0) {
          free(local_80.data);
        }
      }
      else {
        (*(local_80.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-16a-maxk-inch/16a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 16 * maxk, inch / 16, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}